

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_node_addchild(lys_node *parent,lys_module *module,lys_node *child)

{
  lys_module *plVar1;
  LY_STMT stmt;
  int iVar2;
  char *pcVar3;
  ly_ctx *plVar4;
  char *pcVar5;
  bool bVar6;
  lyext_substmt *local_78;
  lyext_substmt *info;
  void *p;
  int shortcase;
  int type;
  lys_node_case *c;
  lys_node_inout *inout;
  lys_node_inout *out;
  lys_node_inout *in;
  lys_node **pchild;
  lys_node *next;
  lys_node *iter;
  lys_node *child_local;
  lys_module *module_local;
  lys_node *parent_local;
  
  p._0_4_ = 0;
  local_78 = (lyext_substmt *)0x0;
  iter = child;
  child_local = (lys_node *)module;
  module_local = (lys_module *)parent;
  if (child == (lys_node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x2be,
                  "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                 );
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x2c4,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
    if ((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) {
      __assert_fail("!(child->nodetype & (LYS_INPUT | LYS_OUTPUT))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x2c5,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
    p._4_4_ = LYS_UNKNOWN;
  }
  else {
    p._4_4_ = parent->nodetype;
    child_local = (lys_node *)parent->module;
  }
  if (p._4_4_ == LYS_UNKNOWN) {
    if ((child->nodetype & 0xb9bf) == LYS_UNKNOWN) {
      pcVar5 = strnodetype(child->nodetype);
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar5,"(sub)module");
      return 1;
    }
    goto LAB_00179fdc;
  }
  if (p._4_4_ == LYS_CONTAINER) {
LAB_00179c2b:
    if ((child->nodetype & 0xd8bf) == LYS_UNKNOWN) {
      pcVar5 = strnodetype(child->nodetype);
      pcVar3 = strnodetype(*(LYS_NODE *)&module_local->filepath);
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar5,pcVar3);
      return 1;
    }
    goto LAB_00179fdc;
  }
  if (p._4_4_ == LYS_CHOICE) {
    if ((child->nodetype & 0x807f) == LYS_UNKNOWN) {
      pcVar5 = strnodetype(child->nodetype);
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar5,"choice");
      return 1;
    }
    p._0_4_ = (uint)(child->nodetype != LYS_CASE);
    goto LAB_00179fdc;
  }
  if ((p._4_4_ == LYS_LEAF) || (p._4_4_ == LYS_LEAFLIST)) {
LAB_00179e23:
    pcVar5 = strnodetype(child->nodetype);
    pcVar3 = strnodetype(*(LYS_NODE *)&module_local->filepath);
    ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar5,pcVar3);
    pcVar5 = strnodetype(*(LYS_NODE *)&module_local->filepath);
    ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
            "The \"%s\" statement cannot have any data substatement.",pcVar5);
    return 1;
  }
  if (p._4_4_ == LYS_LIST) goto LAB_00179c2b;
  if (p._4_4_ == LYS_ANYXML) goto LAB_00179e23;
  if (p._4_4_ == LYS_CASE) {
    if ((child->nodetype & 0x903f) == LYS_UNKNOWN) {
      pcVar5 = strnodetype(child->nodetype);
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar5,"case");
      return 1;
    }
    goto LAB_00179fdc;
  }
  if (p._4_4_ == LYS_NOTIF) {
LAB_00179c93:
    if ((child->nodetype & 0x983f) == LYS_UNKNOWN) {
      pcVar5 = strnodetype(child->nodetype);
      pcVar3 = strnodetype(*(LYS_NODE *)&module_local->filepath);
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar5,pcVar3);
      return 1;
    }
  }
  else {
    if (p._4_4_ != LYS_RPC) {
      if ((p._4_4_ == LYS_INPUT) || (p._4_4_ == LYS_OUTPUT)) goto LAB_00179c93;
      if ((p._4_4_ == LYS_GROUPING) || (p._4_4_ == LYS_USES)) goto LAB_00179c2b;
      if (p._4_4_ == LYS_AUGMENT) {
        if ((child->nodetype & 0xd0ff) == LYS_UNKNOWN) {
          pcVar5 = strnodetype(child->nodetype);
          pcVar3 = strnodetype(*(LYS_NODE *)&module_local->filepath);
          ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar5,pcVar3);
          return 1;
        }
        goto LAB_00179fdc;
      }
      if (p._4_4_ != LYS_ACTION) {
        if (p._4_4_ == LYS_ANYDATA) goto LAB_00179e23;
        if (p._4_4_ == LYS_EXT) {
          stmt = lys_snode2stmt(child->nodetype);
          info = (lyext_substmt *)
                 lys_ext_complex_get_substmt
                           (stmt,(lys_ext_instance_complex *)module_local,&local_78);
          plVar1 = module_local;
          if (info == (lyext_substmt *)0x0) {
            pcVar5 = strnodetype(iter->nodetype);
            ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,plVar1,pcVar5,(module_local->ctx->dict).recs[0].next
                   );
            return 1;
          }
        }
        goto LAB_00179fdc;
      }
    }
    if ((child->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
      pcVar5 = strnodetype(child->nodetype);
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar5,"rpc");
      return 1;
    }
  }
LAB_00179fdc:
  iVar2 = lys_check_id(iter,(lys_node *)module_local,(lys_module *)child_local);
  if (iVar2 == 0) {
    if (iter->parent != (lys_node *)0x0) {
      lys_node_unlink(iter);
    }
    if (((iter->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) ||
       (*(int *)&module_local->filepath == 0x10000)) {
      if ((uint)p != 0) {
        _shortcase = (lys_module *)calloc(1,0x70);
        plVar4 = (ly_ctx *)lydict_insert((ly_ctx *)child_local->name,iter->name,0);
        _shortcase->ctx = plVar4;
        *(uint16_t *)&_shortcase->dsc = 0x40;
        _shortcase->contact = (char *)child_local;
        *(LYS_NODE *)&_shortcase->filepath = LYS_CASE;
        _shortcase->imp = (lys_import *)_shortcase;
        lys_node_addchild((lys_node *)module_local,(lys_module *)child_local,(lys_node *)_shortcase)
        ;
        module_local = _shortcase;
      }
      if (module_local == (lys_module *)0x0) {
        if (*(long *)&child_local[1].nodetype == 0) {
          *(lys_node **)&child_local[1].nodetype = iter;
        }
        else {
          *(lys_node **)(*(long *)(*(long *)&child_local[1].nodetype + 0x58) + 0x50) = iter;
          iter->prev = *(lys_node **)(*(long *)&child_local[1].nodetype + 0x58);
          *(lys_node **)(*(long *)&child_local[1].nodetype + 0x58) = iter;
        }
      }
      else {
        pchild = (lys_node **)0x0;
        in = (lys_node_inout *)lys_child((lys_node *)module_local,iter->nodetype);
        if (in == (lys_node_inout *)0x0) {
          __assert_fail("pchild",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                        ,0x356,
                        "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                       );
        }
        if ((lys_node *)in->name == (lys_node *)0x0) {
          in->name = (char *)iter;
          iter->parent = (lys_node *)module_local;
          next = iter;
        }
        else if (p._4_4_ == LYS_AUGMENT) {
          for (next = ((lys_node *)in->name)->prev; (lys_module *)next->parent != module_local;
              next = next->prev) {
          }
          pchild = (lys_node **)next->next;
          next->next = iter;
          iter->prev = next;
        }
        else {
          next = ((lys_node *)in->name)->prev;
          next->next = iter;
          iter->prev = next;
        }
        while (next->next != (lys_node *)0x0) {
          next = next->next;
          next->parent = (lys_node *)module_local;
        }
        if (pchild == (lys_node **)0x0) {
          ((lys_node *)in->name)->prev = next;
        }
        else {
          next->next = (lys_node *)pchild;
          pchild[0xb] = next;
        }
      }
    }
    else {
      if (iter->nodetype == LYS_OUTPUT) {
        c = *(lys_node_case **)(*(long *)&module_local->augment_size + 0x50);
      }
      else {
        c = *(lys_node_case **)&module_local->augment_size;
        *(lys_node **)&module_local->augment_size = iter;
      }
      if (c->next == (lys_node *)0x0) {
        *(lys_node **)(*(long *)&module_local->augment_size + 0x58) = iter;
      }
      else {
        iter->next = c->next;
        c->next->prev = iter;
        c->next = (lys_node *)0x0;
      }
      iter->prev = c->prev;
      if (c->prev->next != (lys_node *)0x0) {
        c->prev->next = iter;
      }
      c->prev = (lys_node *)c;
      iter->parent = (lys_node *)module_local;
      c->parent = (lys_node *)0x0;
      lys_node_free((lys_node *)c,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
    }
    next = (lys_node *)module_local;
    while( true ) {
      bVar6 = false;
      if (next != (lys_node *)0x0) {
        bVar6 = (next->nodetype & (LYS_EXT|LYS_AUGMENT|LYS_GROUPING)) == LYS_UNKNOWN;
      }
      if (!bVar6) break;
      next = next->parent;
    }
    if ((module_local != (lys_module *)0x0) && (next == (lys_node *)0x0)) {
      next = iter;
      while( true ) {
        bVar6 = false;
        if (next != (lys_node *)0x0) {
          bVar6 = (next->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN;
        }
        if (!bVar6) break;
        next = next->parent;
      }
      if (((next == (lys_node *)0x0) && (((ulong)module_local->dsc & 2) != 0)) &&
         ((iter->flags & 1) != 0)) {
        ly_vlog(LYE_INARG,LY_VLOG_LYS,iter,"true","config");
        ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "State nodes cannot have configuration nodes as children.");
        return 1;
      }
    }
    if (((iter->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
         LYS_UNKNOWN) && ((iter->flags & 0x80) != 0)) {
      for (next = (lys_node *)module_local; next != (lys_node *)0x0; next = lys_parent(next)) {
        if ((next->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
          if ((next->flags & 0x80) != 0) break;
          next->flags = next->flags | 0x80;
        }
      }
    }
    if ((iter->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
      out = (lys_node_inout *)calloc(1,0x78);
      out->nodetype = LYS_INPUT;
      pcVar5 = lydict_insert(iter->module->ctx,"input",5);
      out->name = pcVar5;
      inout = (lys_node_inout *)calloc(1,0x78);
      pcVar5 = lydict_insert(iter->module->ctx,"output",6);
      inout->name = pcVar5;
      inout->nodetype = LYS_OUTPUT;
      plVar1 = iter->module;
      inout->module = plVar1;
      out->module = plVar1;
      inout->parent = iter;
      out->parent = iter;
      inout->flags = 0x40;
      out->flags = 0x40;
      out->next = (lys_node *)inout;
      out->prev = (lys_node *)inout;
      inout->prev = (lys_node *)out;
      iter->child = (lys_node *)out;
    }
    parent_local._4_4_ = 0;
  }
  else {
    parent_local._4_4_ = 1;
  }
  return parent_local._4_4_;
}

Assistant:

int
lys_node_addchild(struct lys_node *parent, struct lys_module *module, struct lys_node *child)
{
    struct lys_node *iter, *next, **pchild;
    struct lys_node_inout *in, *out, *inout;
    struct lys_node_case *c;
    int type, shortcase = 0;
    void *p;
    struct lyext_substmt *info = NULL;

    assert(child);

    if (parent) {
        type = parent->nodetype;
        module = parent->module;
    } else {
        assert(module);
        assert(!(child->nodetype & (LYS_INPUT | LYS_OUTPUT)));
        type = 0;
    }

    /* checks */
    switch (type) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
    case LYS_USES:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_CHOICE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "choice");
            return EXIT_FAILURE;
        }
        if (child->nodetype != LYS_CASE) {
            shortcase = 1;
        }
        break;
    case LYS_CASE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "case");
            return EXIT_FAILURE;
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (!(child->nodetype & (LYS_INPUT | LYS_OUTPUT | LYS_GROUPING))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "rpc");
            return EXIT_FAILURE;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
        LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "The \"%s\" statement cannot have any data substatement.",
               strnodetype(parent->nodetype));
        return EXIT_FAILURE;
    case LYS_AUGMENT:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_UNKNOWN:
        /* top level */
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_GROUPING
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_RPC | LYS_NOTIF | LYS_AUGMENT))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "(sub)module");
            return EXIT_FAILURE;
        }
        break;
    case LYS_EXT:
        /* plugin-defined */
        p = lys_ext_complex_get_substmt(lys_snode2stmt(child->nodetype), (struct lys_ext_instance_complex*)parent, &info);
        if (!p) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype),
                   ((struct lys_ext_instance_complex*)parent)->def->name);
            return EXIT_FAILURE;
        }
        /* TODO check cardinality */
        break;
    }

    /* check identifier uniqueness */
    if (lys_check_id(child, parent, module)) {
        return EXIT_FAILURE;
    }

    if (child->parent) {
        lys_node_unlink(child);
    }

    if ((child->nodetype & (LYS_INPUT | LYS_OUTPUT)) && parent->nodetype != LYS_EXT) {
        /* replace the implicit input/output node */
        if (child->nodetype == LYS_OUTPUT) {
            inout = (struct lys_node_inout *)parent->child->next;
        } else { /* LYS_INPUT */
            inout = (struct lys_node_inout *)parent->child;
            parent->child = child;
        }
        if (inout->next) {
            child->next = inout->next;
            inout->next->prev = child;
            inout->next = NULL;
        } else {
            parent->child->prev = child;
        }
        child->prev = inout->prev;
        if (inout->prev->next) {
            inout->prev->next = child;
        }
        inout->prev = (struct lys_node *)inout;
        child->parent = parent;
        inout->parent = NULL;
        lys_node_free((struct lys_node *)inout, NULL, 0);
    } else {
        if (shortcase) {
            /* create the implicit case to allow it to serve as a target of the augments,
             * it won't be printed, but it will be present in the tree */
            c = calloc(1, sizeof *c);
            c->name = lydict_insert(module->ctx, child->name, 0);
            c->flags = LYS_IMPLICIT;
            c->module = module;
            c->nodetype = LYS_CASE;
            c->prev = (struct lys_node*)c;
            lys_node_addchild(parent, module, (struct lys_node*)c);
            parent = (struct lys_node*)c;
        }
        /* connect the child correctly */
        if (!parent) {
            if (module->data) {
                module->data->prev->next = child;
                child->prev = module->data->prev;
                module->data->prev = child;
            } else {
                module->data = child;
            }
        } else {
            next = NULL;
            pchild = lys_child(parent, child->nodetype);
            assert(pchild);

            if (!(*pchild)) {
                /* the only/first child of the parent */
                *pchild = child;
                child->parent = parent;
                iter = child;
            } else if (type == LYS_AUGMENT) {
                /* add a new child as a last child of the augment (no matter if applied or not) */
                for (iter = (*pchild)->prev; iter->parent != parent; iter = iter->prev);
                next = iter->next;
                iter->next = child;
                child->prev = iter;
            } else {
                /* add a new child at the end of parent's child list */
                iter = (*pchild)->prev;
                iter->next = child;
                child->prev = iter;
            }
            while (iter->next) {
                iter = iter->next;
                iter->parent = parent;
            }
            if (next) {
                /* we are in applied augment, its target has some additional nodes after the nodes from this augment */
                iter->next = next;
                next->prev = iter;
            } else {
                (*pchild)->prev = iter;
            }
        }
    }

    /* check config value (but ignore them in groupings and augments) */
    for (iter = parent; iter && !(iter->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); iter = iter->parent);
    if (parent && !iter) {
        for (iter = child; iter && !(iter->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); iter = iter->parent);
        if (!iter && (parent->flags & LYS_CONFIG_R) && (child->flags & LYS_CONFIG_W)) {
            LOGVAL(LYE_INARG, LY_VLOG_LYS, child, "true", "config");
            LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
            return EXIT_FAILURE;
        }
    }

    /* propagate information about status data presence */
    if ((child->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) &&
            (child->flags & LYS_INCL_STATUS)) {
        for(iter = parent; iter; iter = lys_parent(iter)) {
            /* store it only into container or list - the only data inner nodes */
            if (iter->nodetype & (LYS_CONTAINER | LYS_LIST)) {
                if (iter->flags & LYS_INCL_STATUS) {
                    /* done, someone else set it already from here */
                    break;
                }
                /* set flag about including status data */
                iter->flags |= LYS_INCL_STATUS;
            }
        }
    }

    /* create implicit input/output nodes to have available them as possible target for augment */
    if (child->nodetype & (LYS_RPC | LYS_ACTION)) {
        in = calloc(1, sizeof *in);
        in->nodetype = LYS_INPUT;
        in->name = lydict_insert(child->module->ctx, "input", 5);
        out = calloc(1, sizeof *out);
        out->name = lydict_insert(child->module->ctx, "output", 6);
        out->nodetype = LYS_OUTPUT;
        in->module = out->module = child->module;
        in->parent = out->parent = child;
        in->flags = out->flags = LYS_IMPLICIT;
        in->next = (struct lys_node *)out;
        in->prev = (struct lys_node *)out;
        out->prev = (struct lys_node *)in;
        child->child = (struct lys_node *)in;
    }
    return EXIT_SUCCESS;
}